

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O0

uchar  [8] GetAddressAndPortAsString_abi_cxx11_(Address address)

{
  Address address_00;
  int __val;
  undefined8 in_RDX;
  uchar auVar1 [8];
  Address address_01;
  __cxx11 local_a8 [48];
  uchar local_78 [8];
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [39];
  undefined1 local_21;
  uchar auStack_20 [8];
  Address address_local;
  string *s;
  
  address_01.sin_zero = address.sin_zero;
  auVar1 = address._0_8_;
  local_21 = 0;
  address_01._0_8_ = local_68;
  local_78 = address_01.sin_zero;
  auStack_20 = address_01.sin_zero;
  address_local._0_8_ = in_RDX;
  address_local.sin_zero = auVar1;
  GetAddressAsString_abi_cxx11_(address_01);
  std::operator+(local_48,(char *)local_68);
  address_00.sin_zero = (uchar  [8])address_local._0_8_;
  address_00._0_8_ = auStack_20;
  __val = GetPort(address_00);
  std::__cxx11::to_string(local_a8,__val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar1,
                 local_48);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string(local_68);
  auVar1[0] = auVar1[0];
  auVar1[1] = auVar1[1];
  auVar1[2] = auVar1[2];
  auVar1[3] = auVar1[3];
  auVar1[4] = auVar1[4];
  auVar1[5] = auVar1[5];
  auVar1[6] = auVar1[6];
  auVar1[7] = auVar1[7];
  return auVar1;
}

Assistant:

std::string GetAddressAndPortAsString(Address address){
    std::string s = GetAddressAsString(address) + ":" + std::to_string(GetPort(address));
    return s;
}